

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Rml::Context::RequestNextUpdate(Context *this,double delay)

{
  code *pcVar1;
  bool bVar2;
  double dVar3;
  
  if (delay < 0.0) {
    bVar2 = Assert("RMLUI_ASSERT(delay >= 0.0)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Context.cpp"
                   ,0x580);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  dVar3 = this->next_update_timeout;
  if (delay <= this->next_update_timeout) {
    dVar3 = delay;
  }
  this->next_update_timeout = dVar3;
  return;
}

Assistant:

void Context::RequestNextUpdate(double delay)
{
	RMLUI_ASSERT(delay >= 0.0);
	next_update_timeout = Math::Min(next_update_timeout, delay);
}